

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O3

void markBonds(atom *src,atom *neighbors,int distcount,int max)

{
  char *__s2;
  residue_t *prVar1;
  residue_t *prVar2;
  int iVar3;
  int iVar4;
  atom *paVar5;
  char *pcVar6;
  atom *paVar7;
  char *pcVar8;
  atom_t *src_00;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  if (neighbors != (atom *)0x0) {
    __s2 = src->atomname;
    src_00 = neighbors;
    do {
      if (src_00->mark == 0 || distcount < src_00->mark) {
        dVar9 = 0.2;
        if (UseStdBond == '\0') {
          dVar9 = 0.0;
        }
        dVar12 = (src->loc).x - (src_00->loc).x;
        dVar10 = (src->loc).y - (src_00->loc).y;
        dVar11 = (src->loc).z - (src_00->loc).z;
        dVar10 = dVar11 * dVar11 + dVar12 * dVar12 + dVar10 * dVar10;
        dVar11 = (double)(src->covRad + src_00->covRad);
        dVar12 = dVar11 + 0.2 + dVar9;
        if ((dVar10 <= dVar12 * dVar12) && (dVar9 = (dVar11 + -0.6) - dVar9, dVar9 * dVar9 < dVar10)
           ) {
          iVar3 = getAtno(src->elem);
          iVar4 = getAtno(src_00->elem);
          if ((iVar3 != 1) && (iVar4 != 1)) {
            if (UseStdBond == '\x01') {
              prVar1 = src->r;
              prVar2 = src_00->r;
              if ((prVar1 != prVar2) &&
                 (((((prVar1->resid != prVar2->resid || (prVar1->resInsCode != prVar2->resInsCode))
                    || (iVar3 = strcmp(prVar1->chain,prVar2->chain), iVar3 != 0)) ||
                   (prVar1->model != prVar2->model)) ||
                  ((SplitBySegID == '\x01' &&
                   (iVar3 = strcmp(prVar1->segid,prVar2->segid), iVar3 != 0)))))) {
                if ((src->props & 1) == 0) {
                  if (((((src_00->props & 1U) == 0) &&
                       (iVar3 = strcmp(prVar1->resname,"CYS"), iVar3 == 0)) &&
                      (iVar3 = strcmp(__s2," SG "), iVar3 == 0)) &&
                     ((iVar3 = strcmp(prVar2->resname,"CYS"), iVar3 == 0 &&
                      (iVar3 = strcmp(src_00->atomname," SG "), iVar3 == 0)))) goto LAB_00134d6d;
                }
                else if ((src_00->props & 1U) != 0) {
                  iVar3 = strcmp(" N  ",__s2);
                  if ((iVar3 != 0) || (iVar3 = strcmp(" C  ",src_00->atomname), iVar3 != 0)) {
                    pcVar6 = src_00->atomname;
                    iVar3 = strcmp(" N  ",pcVar6);
                    if (((iVar3 != 0) || (iVar3 = strcmp(" C  ",__s2), iVar3 != 0)) &&
                       ((iVar3 = strcmp(" P  ",__s2), iVar3 != 0 ||
                        (pcVar8 = strstr(" O3*: O3\'",pcVar6), pcVar8 == (char *)0x0)))) {
                      iVar3 = strcmp(" P  ",pcVar6);
                      if (iVar3 == 0) {
                        pcVar8 = " O3*: O3\'";
                        pcVar6 = __s2;
                        goto LAB_00134d5b;
                      }
                      goto LAB_00134d95;
                    }
                  }
                  goto LAB_00134d6d;
                }
                goto LAB_00134d95;
              }
              pcVar8 = src->bondedto;
              if (pcVar8 != (char *)0x0) {
                pcVar6 = src_00->atomname;
LAB_00134d5b:
                pcVar6 = strstr(pcVar8,pcVar6);
                if (pcVar6 == (char *)0x0) goto LAB_00134d95;
              }
            }
            goto LAB_00134d6d;
          }
          if ((iVar3 != 1) || (iVar4 != 1)) {
            prVar1 = src->r;
            prVar2 = src_00->r;
            if ((prVar1 == prVar2) ||
               ((((prVar1->resid == prVar2->resid && (prVar1->resInsCode == prVar2->resInsCode)) &&
                 (iVar4 = strcmp(prVar1->chain,prVar2->chain), iVar4 == 0)) &&
                ((prVar1->model == prVar2->model &&
                 ((SplitBySegID != '\x01' ||
                  (iVar4 = strcmp(prVar1->segid,prVar2->segid), iVar4 == 0)))))))) {
              paVar5 = src_00;
              if (iVar3 == 1) {
                paVar5 = src;
              }
              if (paVar5->bondedto != (char *)0x0) {
                paVar7 = src;
                if (iVar3 == 1) {
                  paVar7 = src_00;
                }
                pcVar6 = strstr(paVar5->bondedto,paVar7->atomname);
                if ((pcVar6 == (char *)0x0) && ((UseHParent & 1) == 0)) goto LAB_00134d95;
              }
LAB_00134d6d:
              src_00->mark = distcount;
              if (distcount < max) {
                markBonds(src_00,neighbors,distcount + 1,max);
              }
            }
          }
        }
      }
LAB_00134d95:
      src_00 = src_00->scratch;
    } while (src_00 != (atom_t *)0x0);
  }
  return;
}

Assistant:

void markBonds(atom *src, atom *neighbors, int distcount, int max)
{/*markBonds  reformated 041112*/
   atom *targ = NULL, *theHatom = NULL, *theOtherAtom = NULL;
   int nearpt, tooclose, isAanH, isBanH, letItBond = FALSE;

   /*when making surface dots, max==1 */
   /*when looking for contacts and clashes, max==Maxbonded */

   for(targ = neighbors; targ; targ = targ->scratch)
   {/*for(loop over neighbors)*/

      /*first pass look at neighbors of external calling atom: targ->mark == 0*/
      /*later look at neighbors of neighbors: targ->mark > max */
      /* until Maxbonded neighbor when targ->mark == max */

      if (targ->mark == 0 || targ->mark > distcount)
      {/*if(targ->mark == 0 || targ->mark > distcount) */

	 /* note: when we are relying on the StdBond table   */
	 /*       to figure out which bonds are allowed      */
	 /*       we can be more generous with the distance  */
	 /*       cuttofs to permit more oddball distortions */
         /*dcr: so it seems that with UseStdBond 2*COVRADFUDGE is added */
         /*atomprops.h/defines COVRADFUDGE 0.2        050111 */

#ifdef INLINE_FOR_SPEED
	 nearpt = INRANGEINLINE((src->loc), (targ->loc),
		     src->covRad + targ->covRad + COVRADFUDGE
		     + (UseStdBond ? COVRADFUDGE : 0.0) );

	 tooclose = INRANGEINLINE((src->loc), (targ->loc),
			   src->covRad + targ->covRad - 0.6
			   - (UseStdBond ? COVRADFUDGE : 0.0) );
#else
	 nearpt = inRange(&(src->loc), &(targ->loc),
		     src->covRad + targ->covRad + COVRADFUDGE
		     + (UseStdBond ? COVRADFUDGE : 0.0) );

	 tooclose = inRange(&(src->loc), &(targ->loc),
			   src->covRad + targ->covRad - 0.6
			   - (UseStdBond ? COVRADFUDGE : 0.0) );
#endif
            /*returns true when distance-sq between a and b <= limit-sq */

/*050111 tooclose=   does NOT seem to be the call where */
/*atoms that move too close together suddenly stop showing bad clashes ! */
/*i.e. force tooclose = 0  here does not affect very close clash cut-off*/
/* and indeed atoms not bonded because of tooclose should show clashes !? */
/*but actual close distance of cut-off seems to be dependent on UseStdBond */
/*so since this is the only place where COVRADFUDGE is used, one suspects */
/*that this markBonds() is responsible for showing as bonded those atoms */
/*that fail to show clashes as they get near to each other*/
/*However, although this markBonds seems to check each atom pair many times, */
/*it does look as if it declares the letItBond flag correctly even when close!*/
/*050111 BUT this seems where all bonding info is calc, so maybe letItBond is */
/*not interpreted correctly by this analysis...*/
/*050117 specific case of ala_dipeptide at phi==0,psi==0, tau<= 102.25 seems */
/*the N of res 2 is just within bonding criteria of C of res 0 and with*/
/*UseStdBond N -- C  bonds are allowed between atoms of different residues*/
/*thus the covalent neighbors of that N and that C, e.g. NH of 2 and O of 0 */
/*are also considered to NOT clash! */
/*For autobondrot and mage/probe strict succession would cure this...*/
/*BUT one does need to allow for deletions in residue order!*/
/*SO this is a FEATURE, NOT a BUG */
/*and the work-around is to restrict the tau deviation to what is more */
/*reasonable for tau anyway of  -8, thus -5 to +10 around ideal 111.1 */
/*might be the best range for getting a feel for allowable phi,psi regions*/

	 /* conditions for allowing a bond to be formed... */

	 if (nearpt && (! tooclose) )
         {/*close enough for a bond*/
	    isAanH = isHatom(src->elem);
	    isBanH = isHatom(targ->elem);

#ifdef OLD_BONDING_CALC
	    if(  (   ! isAanH && ! isBanH ) /* neither atom is a hydrogen  */
	       ||(  (! isAanH || ! isBanH) /*or one is an H */
	          && ATOMS_IN_THE_SAME_RES(src, targ) /* and both are in same*/
                                                      /* res with parent name*/
	          &&(  (theHatom->bondedto == NULL) /*and either unknown */
                     or as expected*/
	             || strstr(theHatom->bondedto, theOtherAtom->atomname)
                                                                           ) ) )
            {
	       targ->mark = distcount;
	       if (distcount < max) {
		  markBonds(targ, neighbors, distcount+1, max);
	       }
	    }
#else /*NOT OLD_BONDING_CALC*/
	    letItBond = FALSE; /* we start out skeptical */
	    if ((! isAanH) && (! isBanH))
            {/* neither atom is a hydrogen - both are heavy atoms */

	       if (UseStdBond)
               {/* if we are allowing only "standard" bonding */

		  if (! ATOMS_IN_THE_SAME_RES(src, targ))
                  { /* and are in diff res */

		     if ((src->props & MC_PROP) && (targ->props & MC_PROP))
                     {/* both are mc in diff res - */
                        /*only specific bonding patterns allowed */

                        /*strcmp(a,b) returns 0 when strings == (a==b) */
                        /*strstr returns 1 when any str in colon delineated*/
                        /* list matches reference str */

			letItBond =
                           (    !strcmp(" N  ", src->atomname)
                             && !strcmp(" C  ",targ->atomname) )
                        || (    !strcmp(" N  ",targ->atomname)
                             && !strcmp(" C  ", src->atomname) )
			|| (    !strcmp(" P  ", src->atomname)
                             &&  strstr(" O3*: O3'", targ->atomname) )
			|| (    !strcmp(" P  ",targ->atomname)
                             &&  strstr(" O3*: O3'",  src->atomname) );
		     }
		     else if(   !(src->props & MC_PROP)
                             && !(targ->props & MC_PROP) )
                     {
			/* both are sc in diff res they must be CYS-CYS SS */
			letItBond = (   !strcmp(src->r->resname,  "CYS")
                                     && !strcmp(src->atomname,   " SG ")
				     && !strcmp(targ->r->resname, "CYS")
                                     && !strcmp(targ->atomname,  " SG ") );
		     }

                     /*050121 remove dcr041112 code insertion */
                        /*inserted test to allow mage/probe fitting of a*/
                        /*particular sidechain in context of an NMR ensemble*/
                     /*Lmodeltest not needed, mage sends model # when needed*/

                  }/* and are in diff res */
		  else
                  {/* both heavy atoms in same res */
                        /*strstr returns 1 when any str in colon delineated*/
                        /* list matches reference str */
#ifdef STRICT_CONN_TABLE /*050111 seems to be not defined*/
		     /* strict - heavy atom must be as exactly expected */
		     letItBond = (   (src->bondedto != NULL)
                                  && strstr(src->bondedto, targ->atomname) );
#else /*NOT STRICT_CONN_TABLE*/
		     /* heavy atom either unknown or as expected */
		     letItBond = (   (src->bondedto == NULL)
                                  || strstr(src->bondedto, targ->atomname) );
#endif /*def? STRICT_CONN_TABLE*/
		  }
               }/* if we are allowing only "standard" bonding */
	       else
               {/* not using std bond table - */
                  /*so we let heavy atoms bond when they are close enough */
		  letItBond = TRUE;
	       }
            }/* neither atom is a hydrogen - both are heavy atoms */
	    else if(   (! isAanH || ! isBanH) /* only one atom is a hydrogen */
	            && ATOMS_IN_THE_SAME_RES(src, targ) ) /* and both atoms*/
                                                       /* are in the same res*/
            {
	       if (isAanH) { theHatom = src;  theOtherAtom = targ; }
	       else        { theHatom = targ; theOtherAtom = src;  }

	       if(  (theHatom->bondedto == NULL) /* heavy atom either unknown*/
                                                 /*  or as expected */
	          || strstr(theHatom->bondedto, theOtherAtom->atomname)
	          || (UseHParent == FALSE) )
               {
		  letItBond = TRUE;
	       }
	    }
	    else
            {/*either both are hydrogens in the same residue- no bond possible*/
	       /*  or one is a H and they are in diff res - no bond possible */
	       letItBond = FALSE;
	    }

	    if (letItBond) /*check connectivity through Maxbonded neighbors*/
            {
	       targ->mark = distcount; /*initially == 1 as called externally*/
	       if (distcount < max)  /*max == Maxbonded  as input or defaulted*/
               {/*reentrant: no clashes between atoms within Maxbonded bonds*/
		  markBonds(targ, neighbors, distcount+1, max);
	       }
               /*else targ->mark == max > discount and loop will end*/
#ifdef DUMP_DEBUG_EXTRA
	       if (DebugLevel > 7)
               {
		  fprintf(stdout, "{%4.4s%c%3.3s%s%4.4s%c}P %8.3f%8.3f%8.3f\n",
			   src->atomname, src->altConf,
			   src->r->resname, src->r->chain,
			   src->r->Hy36resno, src->r->resInsCode,
			   src->loc.x, src->loc.y, src->loc.z);
		  fprintf(stdout, "{%4.4s%c%3.3s%s%4.4s%c}L %8.3f%8.3f%8.3f\n",
			   targ->atomname, targ->altConf,
			   targ->r->resname, targ->r->chain,
			   targ->r->Hy36resno, targ->r->resInsCode,
			   targ->loc.x, targ->loc.y, targ->loc.z);
	       }
#endif /*DUMP_DEBUG_EXTRA*/
	    }
#endif /*def? OLD_BONDING_CALC not defined as of 050111*/
         }/*close enough for a bond*/
      }/*if(targ->mark == 0 || targ->mark > distcount) */

   }/*for(loop over neighbors)*/
}